

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O1

void avro::ensureType<std::vector<avro::json::Entity,std::allocator<avro::json::Entity>>>
               (Entity *e,string *name)

{
  Exception *this;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined1 local_150 [32];
  char *local_130;
  put_holder<char,_std::char_traits<char>_> local_128;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  
  if (e->type_ == etArray) {
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_110,"Json field \"%1%\" is not a %2%: %3%");
  local_150._8_8_ =
       boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_150._16_8_ =
       boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_150._0_8_ = name;
  pbVar1 = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     (&local_110,(put_holder<char,_std::char_traits<char>_> *)local_150);
  local_150._0_8_ = &local_130;
  local_130 = "array";
  local_150._8_8_ = boost::io::detail::call_put_head<char,std::char_traits<char>,char_const*const>;
  local_150._16_8_ = boost::io::detail::call_put_last<char,std::char_traits<char>,char_const*const>;
  pbVar1 = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     (pbVar1,(put_holder<char,_std::char_traits<char>_> *)local_150);
  json::Entity::toString_abi_cxx11_((string *)local_150,e);
  local_128.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_128.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_128.arg = (string *)local_150;
  pbVar1 = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     (pbVar1,&local_128);
  Exception::Exception(this,pbVar1);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void ensureType(const Entity& e, const string& name)
{
    if (e.type() != json::type_traits<T>::type()) {
        throw Exception(boost::format("Json field \"%1%\" is not a %2%: %3%") %
            name % json::type_traits<T>::name() % e.toString());
    }
}